

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  int iVar1;
  wchar_t *__dest;
  undefined1 *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  char_type buffer [13];
  undefined1 local_68 [56];
  
  __dest = *it;
  uVar4 = *(uint *)this;
  iVar1 = *(int *)(this + 4);
  lVar11 = (long)iVar1;
  puVar2 = local_68 + lVar11 * 4;
  if (uVar4 < 100) {
    bVar12 = false;
  }
  else {
    iVar5 = -1;
    uVar7 = 1;
    iVar8 = -2;
    uVar9 = 2;
    do {
      uVar3 = uVar4;
      uVar10 = (ulong)((uVar3 % 100) * 2);
      *(int *)(puVar2 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar10 + 1];
      lVar6 = -4;
      if ((uVar7 / 3) * 3 + iVar5 == 0) {
        *(undefined4 *)(puVar2 + -8) = *(undefined4 *)(this + 8);
        lVar6 = -8;
      }
      *(int *)(puVar2 + lVar6 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar10];
      if ((int)(uVar9 / 3) * 3 + iVar8 == 0) {
        *(undefined4 *)(puVar2 + lVar6 + -8) = *(undefined4 *)(this + 8);
        lVar6 = lVar6 + -8;
      }
      else {
        lVar6 = lVar6 + -4;
      }
      puVar2 = puVar2 + lVar6;
      iVar5 = iVar5 + -2;
      uVar7 = uVar7 + 2;
      iVar8 = iVar8 + -2;
      uVar9 = (ulong)((int)uVar9 + 2);
      uVar4 = uVar3 / 100;
    } while (9999 < uVar3);
    bVar12 = iVar5 + (uVar7 / 3) * 3 == 0;
    uVar4 = uVar3 / 100;
  }
  if (uVar4 < 10) {
    uVar4 = uVar4 | 0x30;
  }
  else {
    *(int *)(puVar2 + -4) =
         (int)(char)internal::basic_data<void>::DIGITS[((ulong)uVar4 * 2 & 0xffffffff) + 1];
    lVar6 = -4;
    if (bVar12) {
      *(undefined4 *)(puVar2 + -8) = *(undefined4 *)(this + 8);
      lVar6 = -8;
    }
    puVar2 = puVar2 + lVar6;
    uVar4 = (uint)(char)internal::basic_data<void>::DIGITS[(ulong)uVar4 * 2];
  }
  *(uint *)(puVar2 + -4) = uVar4;
  if (iVar1 != 0) {
    memcpy(__dest,local_68,lVar11 * 4);
  }
  *it = __dest + lVar11;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }